

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_pwhash(void)

{
  int iVar1;
  unsigned_long_long ops;
  char h_hex [129];
  uint8_t static_key [64];
  uint8_t h [64];
  uint8_t stored [128];
  uint8_t new_master_key [32];
  uint8_t master_key [32];
  undefined8 in_stack_fffffffffffffe08;
  size_t bin_len;
  uint8_t *new_master_key_00;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe14;
  uint8_t *in_stack_fffffffffffffe18;
  char *expected;
  char *hex;
  size_t in_stack_fffffffffffffe28;
  uint8_t *in_stack_fffffffffffffe30;
  uint8_t *in_stack_fffffffffffffe38;
  uint64_t in_stack_fffffffffffffe40;
  uint8_t *in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe50;
  uint8_t *in_stack_fffffffffffffe58;
  uint8_t *in_stack_fffffffffffffe60;
  uint64_t in_stack_fffffffffffffe68;
  uint8_t in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe71;
  uint8_t in_stack_fffffffffffffe78;
  undefined6 in_stack_fffffffffffffe79;
  uint8_t in_stack_fffffffffffffe7f;
  uint8_t in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe81;
  uint64_t in_stack_fffffffffffffe88;
  uint8_t in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe91;
  uint8_t *in_stack_fffffffffffffe98;
  undefined1 local_28 [40];
  
  uVar2 = (undefined4)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  expected = (char *)0x3e8;
  memset(local_28,0x78,0x20);
  bin_len = CONCAT44(uVar2,1);
  hex = expected;
  hydro_pwhash_deterministic
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48,
             in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
             CONCAT71(in_stack_fffffffffffffe71,in_stack_fffffffffffffe70),
             CONCAT17(in_stack_fffffffffffffe7f,
                      CONCAT61(in_stack_fffffffffffffe79,in_stack_fffffffffffffe78)),
             in_stack_fffffffffffffe80);
  hydro_bin2hex(hex,(size_t)in_stack_fffffffffffffe18,
                (uint8_t *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),bin_len);
  if ((hex == (char *)0x3e8) && (iVar1 = streq(expected,(char *)0x103699), iVar1 == 0)) {
    __assert_fail("streq((\"2f1a804a02f25066fd0688bf8b8e03dff3a3866958a9cf5883c459e602e232d38e3e488723f0b4a2bc61d2\" \"0cb36a04a4d2eb18be99bc61870d72d7de5d67f237\"), (h_hex))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1b1,"void test_pwhash(void)");
  }
  hydro_pwhash_keygen((uint8_t *)0x1036ce);
  iVar1 = hydro_pwhash_create((uint8_t *)
                              CONCAT17(in_stack_fffffffffffffe7f,
                                       CONCAT61(in_stack_fffffffffffffe79,in_stack_fffffffffffffe78)
                                      ),
                              (char *)CONCAT71(in_stack_fffffffffffffe71,in_stack_fffffffffffffe70),
                              in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                              (uint64_t)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                              in_stack_fffffffffffffe90);
  if (iVar1 != 0) {
    __assert_fail("hydro_pwhash_create(stored, \"test\", sizeof \"test\" - 1, master_key, ops, 0, 1) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1b5,"void test_pwhash(void)");
  }
  iVar1 = hydro_pwhash_verify(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
                              in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                              in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38,
                              in_stack_fffffffffffffe70);
  if (iVar1 != 0) {
    __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, master_key, ops, 0, 1) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1b6,"void test_pwhash(void)");
  }
  iVar1 = hydro_pwhash_verify(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
                              in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                              in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38,
                              in_stack_fffffffffffffe70);
  if (iVar1 != 0) {
    __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, master_key, ops * 2, 10, 10) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1b8,"void test_pwhash(void)");
  }
  iVar1 = hydro_pwhash_verify(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
                              in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                              in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38,
                              in_stack_fffffffffffffe70);
  if (iVar1 != -1) {
    __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, master_key, ops / 2, 10, 10) == -1"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1ba,"void test_pwhash(void)");
  }
  iVar1 = hydro_pwhash_verify(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
                              in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                              in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38,
                              in_stack_fffffffffffffe70);
  if (iVar1 != -1) {
    __assert_fail("hydro_pwhash_verify(stored, \"Test\", sizeof \"Test\" - 1, master_key, ops, 0, 1) == -1"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1bb,"void test_pwhash(void)");
  }
  iVar1 = hydro_pwhash_verify(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
                              in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                              in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38,
                              in_stack_fffffffffffffe70);
  if (iVar1 != -1) {
    __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"tes\" - 1, master_key, ops, 0, 1) == -1"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1bc,"void test_pwhash(void)");
  }
  iVar1 = hydro_pwhash_derive_static_key
                    (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                     (char *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,hex,
                     in_stack_fffffffffffffe60,in_stack_fffffffffffffe68,
                     CONCAT71(in_stack_fffffffffffffe71,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe78);
  if (iVar1 != 0) {
    __assert_fail("hydro_pwhash_derive_static_key(static_key, sizeof static_key, stored, \"test\", sizeof \"test\" - 1, ctx, master_key, ops, 0, 1) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1bf,"void test_pwhash(void)");
  }
  new_master_key_00 = (uint8_t *)0x0;
  uVar2 = 1;
  iVar1 = hydro_pwhash_derive_static_key
                    (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                     (char *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,hex,
                     in_stack_fffffffffffffe60,in_stack_fffffffffffffe68,
                     CONCAT71(in_stack_fffffffffffffe71,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe78);
  if (iVar1 != -1) {
    __assert_fail("hydro_pwhash_derive_static_key(static_key, sizeof static_key, stored, \"Test\", sizeof \"Test\" - 1, ctx, master_key, ops, 0, 1) == -1"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1c1,"void test_pwhash(void)");
  }
  iVar1 = hydro_pwhash_reencrypt
                    (in_stack_fffffffffffffe18,(uint8_t *)CONCAT44(in_stack_fffffffffffffe14,uVar2),
                     new_master_key_00);
  if (iVar1 != 0) {
    __assert_fail("hydro_pwhash_reencrypt(stored, master_key, master_key) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1c3,"void test_pwhash(void)");
  }
  iVar1 = hydro_pwhash_verify(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
                              in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                              in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38,
                              in_stack_fffffffffffffe70);
  if (iVar1 != 0) {
    __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, master_key, ops, 0, 1) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1c4,"void test_pwhash(void)");
  }
  hydro_pwhash_keygen((uint8_t *)0x103a8a);
  iVar1 = hydro_pwhash_reencrypt
                    (in_stack_fffffffffffffe18,(uint8_t *)CONCAT44(in_stack_fffffffffffffe14,uVar2),
                     new_master_key_00);
  if (iVar1 != 0) {
    __assert_fail("hydro_pwhash_reencrypt(stored, master_key, new_master_key) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1c6,"void test_pwhash(void)");
  }
  iVar1 = hydro_pwhash_verify(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
                              in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                              in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38,
                              in_stack_fffffffffffffe70);
  if (iVar1 != -1) {
    __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, master_key, ops, 0, 1) == -1"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1c7,"void test_pwhash(void)");
  }
  iVar1 = hydro_pwhash_verify(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
                              in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                              in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38,
                              in_stack_fffffffffffffe70);
  if (iVar1 != 0) {
    __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, new_master_key, ops, 0, 1) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                  ,0x1c8,"void test_pwhash(void)");
  }
  iVar1 = hydro_pwhash_upgrade
                    (in_stack_fffffffffffffe98,
                     (uint8_t *)CONCAT71(in_stack_fffffffffffffe91,in_stack_fffffffffffffe90),
                     in_stack_fffffffffffffe88,
                     CONCAT71(in_stack_fffffffffffffe81,in_stack_fffffffffffffe80),
                     in_stack_fffffffffffffe7f);
  if (iVar1 == 0) {
    iVar1 = hydro_pwhash_verify(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
                                in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                                in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38,
                                in_stack_fffffffffffffe70);
    if (iVar1 != -1) {
      __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, new_master_key, ops, 0, 1) == -1"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                    ,0x1cb,"void test_pwhash(void)");
    }
    iVar1 = hydro_pwhash_verify(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58,
                                in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                                in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38,
                                in_stack_fffffffffffffe70);
    if (iVar1 != 0) {
      __assert_fail("hydro_pwhash_verify(stored, \"test\", sizeof \"test\" - 1, new_master_key, ops * 2, 0, 1) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                    ,0x1cd,"void test_pwhash(void)");
    }
    return;
  }
  __assert_fail("hydro_pwhash_upgrade(stored, new_master_key, ops * 2, 0, 1) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jedisct1[P]libhydrogen/tests/tests.c"
                ,0x1ca,"void test_pwhash(void)");
}

Assistant:

static void
test_pwhash(void)
{
    uint8_t            master_key[hydro_pwhash_MASTERKEYBYTES];
    uint8_t            new_master_key[hydro_pwhash_MASTERKEYBYTES];
    uint8_t            stored[hydro_pwhash_STOREDBYTES];
    uint8_t            h[64];
    uint8_t            static_key[64];
    char               h_hex[2 * 64 + 1];
    unsigned long long ops = 1000;

    memset(master_key, 'x', sizeof master_key);
    hydro_pwhash_deterministic(h, sizeof h, "test", sizeof "test" - 1, ctx, master_key, ops, 0, 1);
    hydro_bin2hex(h_hex, sizeof h_hex, h, sizeof h);
    if (ops == 1000) {
        assert_streq(
            "2f1a804a02f25066fd0688bf8b8e03dff3a3866958a9cf5883c459e602e232d38e3e488723f0b4a2bc61d2"
            "0cb36a04a4d2eb18be99bc61870d72d7de5d67f237",
            h_hex);
    }

    hydro_pwhash_keygen(master_key);
    assert(hydro_pwhash_create(stored, "test", sizeof "test" - 1, master_key, ops, 0, 1) == 0);
    assert(hydro_pwhash_verify(stored, "test", sizeof "test" - 1, master_key, ops, 0, 1) == 0);
    assert(hydro_pwhash_verify(stored, "test", sizeof "test" - 1, master_key, ops * 2, 10, 10) ==
           0);
    assert(hydro_pwhash_verify(stored, "test", sizeof "test" - 1, master_key, ops / 2, 10, 10) ==
           -1);
    assert(hydro_pwhash_verify(stored, "Test", sizeof "Test" - 1, master_key, ops, 0, 1) == -1);
    assert(hydro_pwhash_verify(stored, "test", sizeof "tes" - 1, master_key, ops, 0, 1) == -1);

    assert(hydro_pwhash_derive_static_key(static_key, sizeof static_key, stored, "test",
                                          sizeof "test" - 1, ctx, master_key, ops, 0, 1) == 0);
    assert(hydro_pwhash_derive_static_key(static_key, sizeof static_key, stored, "Test",
                                          sizeof "Test" - 1, ctx, master_key, ops, 0, 1) == -1);

    assert(hydro_pwhash_reencrypt(stored, master_key, master_key) == 0);
    assert(hydro_pwhash_verify(stored, "test", sizeof "test" - 1, master_key, ops, 0, 1) == 0);
    hydro_pwhash_keygen(new_master_key);
    assert(hydro_pwhash_reencrypt(stored, master_key, new_master_key) == 0);
    assert(hydro_pwhash_verify(stored, "test", sizeof "test" - 1, master_key, ops, 0, 1) == -1);
    assert(hydro_pwhash_verify(stored, "test", sizeof "test" - 1, new_master_key, ops, 0, 1) == 0);

    assert(hydro_pwhash_upgrade(stored, new_master_key, ops * 2, 0, 1) == 0);
    assert(hydro_pwhash_verify(stored, "test", sizeof "test" - 1, new_master_key, ops, 0, 1) == -1);
    assert(hydro_pwhash_verify(stored, "test", sizeof "test" - 1, new_master_key, ops * 2, 0, 1) ==
           0);
}